

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterValidator.cpp
# Opt level: O0

Result * CoreML::validateDoubleParameter
                   (Result *__return_storage_ptr__,string *parameterName,
                   DoubleParameter *doubleParameter)

{
  bool bVar1;
  double __val;
  double dVar2;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string err;
  DoubleRange *range;
  double defaultValue;
  DoubleParameter *doubleParameter_local;
  string *parameterName_local;
  
  __val = Specification::DoubleParameter::defaultvalue(doubleParameter);
  bVar1 = Specification::DoubleParameter::has_range(doubleParameter);
  if (bVar1) {
    err.field_2._8_8_ = Specification::DoubleParameter::range(doubleParameter);
    dVar2 = Specification::DoubleRange::minvalue((DoubleRange *)err.field_2._8_8_);
    if ((__val < dVar2) ||
       (dVar2 = Specification::DoubleRange::maxvalue((DoubleRange *)err.field_2._8_8_),
       dVar2 < __val)) {
      std::__cxx11::to_string(&local_d0,__val);
      std::operator+(&local_b0,"Specified Default Value (",&local_d0);
      std::operator+(&local_90,&local_b0,") out of Allowed Value Range for \'");
      std::operator+(&local_70,&local_90,parameterName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_70,"\'");
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_50
                    );
      std::__cxx11::string::~string((string *)local_50);
      return __return_storage_ptr__;
    }
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result CoreML::validateDoubleParameter(const std::string& parameterName, const Specification::DoubleParameter& doubleParameter) {

    auto defaultValue = doubleParameter.defaultvalue();

    if (doubleParameter.has_range()) {
        const Specification::DoubleRange& range = doubleParameter.range();

        if (defaultValue < range.minvalue() || defaultValue > range.maxvalue()) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") out of Allowed Value Range for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }

    return Result();
}